

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O1

int KINSetMaxSubSetupCalls(void *kinmem,long msbsetsub)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "kinsol_mem = NULL illegal.";
    iVar1 = -1;
    kinmem = (KINMem)0x0;
    error_code = -1;
    line = 0x180;
  }
  else {
    if (-1 < msbsetsub) {
      if (msbsetsub == 0) {
        *(undefined8 *)((long)kinmem + 0x48) = 5;
      }
      else {
        *(long *)((long)kinmem + 0x48) = msbsetsub;
      }
      return 0;
    }
    msgfmt = "Illegal msbsetsub < 0.";
    iVar1 = -2;
    error_code = -2;
    line = 0x188;
  }
  KINProcessError((KINMem)kinmem,error_code,line,"KINSetMaxSubSetupCalls",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                  ,msgfmt);
  return iVar1;
}

Assistant:

int KINSetMaxSubSetupCalls(void* kinmem, long int msbsetsub)
{
  KINMem kin_mem;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  if (msbsetsub < 0)
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_MSBSETSUB);
    return (KIN_ILL_INPUT);
  }

  if (msbsetsub == 0) { kin_mem->kin_msbset_sub = MSBSET_SUB_DEFAULT; }
  else { kin_mem->kin_msbset_sub = msbsetsub; }

  return (KIN_SUCCESS);
}